

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O0

bool __thiscall
hwnet::TCPConnector::ConnectWithTimeout
          (TCPConnector *this,ConnectCallback *connectFn,size_t timeout,ErrorCallback *errorFn)

{
  undefined1 local_50 [24];
  shared_ptr<hwnet::TCPConnector> self;
  bool ret;
  ErrorCallback *errorFn_local;
  size_t timeout_local;
  ConnectCallback *connectFn_local;
  TCPConnector *this_local;
  
  self.super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       Connect(this,connectFn,errorFn);
  if (((bool)self.super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._7_1_) && (timeout != 0)) {
    std::enable_shared_from_this<hwnet::TCPConnector>::shared_from_this
              ((enable_shared_from_this<hwnet::TCPConnector> *)(local_50 + 0x10));
    Poller::
    addTimerOnce<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPConnector>),std::shared_ptr<hwnet::TCPConnector>&>
              ((Poller *)local_50,(milliseconds)this->poller_,
               (_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPConnector> *)
               timeout,(shared_ptr<hwnet::TCPConnector> *)connectTimeout);
    std::weak_ptr<hwnet::util::Timer>::operator=
              (&this->connectTimer,(weak_ptr<hwnet::util::Timer> *)local_50);
    std::weak_ptr<hwnet::util::Timer>::~weak_ptr((weak_ptr<hwnet::util::Timer> *)local_50);
    std::shared_ptr<hwnet::TCPConnector>::~shared_ptr
              ((shared_ptr<hwnet::TCPConnector> *)(local_50 + 0x10));
  }
  return (bool)(self.super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi._7_1_ & 1);
}

Assistant:

bool TCPConnector::ConnectWithTimeout(const ConnectCallback &connectFn,size_t timeout,const ErrorCallback &errorFn) {
	bool ret = Connect(connectFn,errorFn);
	if(ret && timeout > 0) {
		auto self = shared_from_this();
		this->connectTimer = poller_->addTimerOnce(timeout,TCPConnector::connectTimeout,self);
	}
	return ret;
}